

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O0

int Sle_ManComputeDelayOne(Gia_Man_t *p,int iObj,Vec_Int_t *vCuts,Vec_Int_t *vTime)

{
  int iVar1;
  int *piVar2;
  int *pList;
  int DelayMin;
  int Delay;
  int *pCut;
  int i;
  Vec_Int_t *vTime_local;
  Vec_Int_t *vCuts_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  pList._0_4_ = 1000000000;
  iVar1 = Vec_IntEntry(vCuts,iObj);
  piVar2 = Vec_IntEntryP(vCuts,iVar1);
  pCut._4_4_ = 0;
  _DelayMin = piVar2 + 1;
  while (pCut._4_4_ < *piVar2) {
    iVar1 = Sle_ManComputeDelayCut(p,_DelayMin,vTime);
    pList._0_4_ = Abc_MinInt((int)pList,iVar1);
    pCut._4_4_ = pCut._4_4_ + 1;
    iVar1 = Sle_CutSize(_DelayMin);
    _DelayMin = _DelayMin + (iVar1 + 1);
  }
  Vec_IntWriteEntry(vTime,iObj,(int)pList);
  return (int)pList;
}

Assistant:

int Sle_ManComputeDelayOne( Gia_Man_t * p, int iObj, Vec_Int_t * vCuts, Vec_Int_t * vTime )
{
    int i, * pCut, Delay, DelayMin = ABC_INFINITY;
    int * pList = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, iObj) );
    Sle_ForEachCut( pList, pCut, i )
    {
        Delay = Sle_ManComputeDelayCut( p, pCut, vTime );
        DelayMin = Abc_MinInt( DelayMin, Delay );
    }
    Vec_IntWriteEntry( vTime, iObj, DelayMin );
    return DelayMin;
}